

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:565:59)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:565:59)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  pointer pvVar1;
  bool bVar2;
  uint32_t uVar3;
  value *pvVar4;
  gc_heap_ptr_untyped *this_00;
  undefined8 *puVar5;
  long lVar6;
  object *this_01;
  long *plVar7;
  long *plVar8;
  uint32_t index;
  uint32_t index_00;
  long extraout_RDX;
  pointer pvVar9;
  uint uVar10;
  uint32_t uVar11;
  value local_110;
  value *local_e8;
  gc_heap_ptr_untyped *local_e0;
  long local_d8;
  gc_heap *local_d0;
  wstring last_idx;
  wstring this_idx;
  size_type local_70;
  pointer local_68;
  wstring_view local_60;
  gc_heap_ptr_untyped local_50;
  
  local_e8 = __return_storage_ptr__;
  pvVar4 = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  global_object::validate_object((global_object *)&stack0xffffffffffffffc0,pvVar4);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffc0);
  this_00 = &value::object_value(this_)->super_gc_heap_ptr_untyped;
  local_d0 = (this->f).global.super_gc_heap_ptr_untyped.heap_;
  puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(this_00);
  last_idx._M_dataplus._M_p = (pointer)0x6;
  last_idx._M_string_length = 0x17cf74;
  (**(code **)*puVar5)(&local_110,puVar5);
  uVar3 = to_uint32(&local_110);
  value::~value(&local_110);
  lVar6 = (long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_d8 = lVar6 / 0x28;
  lVar6 = lVar6 % 0x28;
  uVar11 = uVar3;
  while( true ) {
    uVar11 = uVar11 - 1;
    if (uVar11 == 0xffffffff) break;
    index_string_abi_cxx11_(&last_idx,(mjs *)(ulong)uVar11,(uint32_t)lVar6);
    index_string_abi_cxx11_(&this_idx,(mjs *)(ulong)((int)local_d8 + uVar11),index);
    this_01 = (object *)gc_heap_ptr_untyped::get(this_00);
    local_110._0_8_ = last_idx._M_string_length;
    local_110.field_1.n_ = (double)last_idx._M_dataplus._M_p;
    bVar2 = object::has_property(this_01,(wstring_view *)&local_110);
    if (bVar2) {
      plVar7 = (long *)gc_heap_ptr_untyped::get(this_00);
      local_60._M_len = this_idx._M_string_length;
      local_60._M_str = this_idx._M_dataplus._M_p;
      string::string((string *)&local_50,local_d0,&local_60);
      puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(this_00);
      local_70 = last_idx._M_string_length;
      local_68 = last_idx._M_dataplus._M_p;
      (**(code **)*puVar5)(&local_110,puVar5,&local_70);
      (**(code **)(*plVar7 + 8))(plVar7,&local_50,&local_110,0);
      value::~value(&local_110);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_50);
    }
    else {
      plVar7 = (long *)gc_heap_ptr_untyped::get(this_00);
      local_110._0_8_ = this_idx._M_string_length;
      local_110.field_1.n_ = (double)this_idx._M_dataplus._M_p;
      (**(code **)(*plVar7 + 0x10))(plVar7,&local_110);
    }
    std::__cxx11::wstring::~wstring((wstring *)&this_idx);
    std::__cxx11::wstring::~wstring((wstring *)&last_idx);
    lVar6 = extraout_RDX;
  }
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar10 = 0;
  local_e0 = this_00;
  for (pvVar9 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                super__Vector_impl_data._M_start; pvVar4 = local_e8, pvVar9 != pvVar1;
      pvVar9 = pvVar9 + 1) {
    plVar7 = (long *)gc_heap_ptr_untyped::get(local_e0);
    index_string_abi_cxx11_((wstring *)&local_110,(mjs *)(ulong)uVar10,index_00);
    this_idx._M_dataplus._M_p = (pointer)local_110.field_1.n_;
    this_idx._M_string_length = local_110._0_8_;
    string::string((string *)&last_idx,local_d0,(wstring_view *)&this_idx);
    (**(code **)(*plVar7 + 8))(plVar7,&last_idx,pvVar9,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&last_idx);
    std::__cxx11::wstring::~wstring((wstring *)&local_110);
    uVar10 = uVar10 + 1;
  }
  local_e8->type_ = number;
  (local_e8->field_1).n_ = (double)(uVar3 + (int)local_d8);
  plVar7 = (long *)gc_heap_ptr_untyped::get(local_e0);
  plVar8 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  (**(code **)(*plVar8 + 0x98))(&local_110,plVar8,"length");
  (**(code **)(*plVar7 + 8))(plVar7,&local_110,pvVar4,0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_110);
  return pvVar4;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }